

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcf_escape_new(mpc_val_t *x,char *input,char **output)

{
  char cVar1;
  long lVar2;
  char *__s;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  char *__s_00;
  long lVar6;
  bool bVar7;
  char buff [2];
  char local_42;
  undefined1 local_41;
  char *local_40;
  size_t local_38;
  
  local_40 = input;
  __s = (char *)calloc(1,1);
  cVar1 = *x;
  pcVar5 = local_40;
  do {
    if (cVar1 == '\0') {
      return __s;
    }
    __s_00 = *output;
    bVar7 = __s_00 == (char *)0x0;
    if (!bVar7) {
      if (cVar1 == *pcVar5) {
        lVar6 = 0;
      }
      else {
        lVar4 = 0;
        do {
          __s_00 = output[lVar4 + 1];
          bVar7 = __s_00 == (char *)0x0;
          if (bVar7) goto LAB_001e3392;
          lVar6 = lVar4 + 1;
          lVar2 = lVar4 + 1;
          lVar4 = lVar6;
        } while (cVar1 != pcVar5[lVar2]);
      }
      local_38 = strlen(__s);
      sVar3 = strlen(__s_00);
      __s = (char *)realloc(__s,local_38 + sVar3 + 1);
      strcat(__s,output[lVar6]);
      pcVar5 = local_40;
    }
LAB_001e3392:
    if (bVar7) {
      sVar3 = strlen(__s);
      __s = (char *)realloc(__s,sVar3 + 2);
      local_42 = *x;
      local_41 = 0;
      strcat(__s,&local_42);
      pcVar5 = local_40;
    }
    cVar1 = *(char *)((long)x + 1);
    x = (mpc_val_t *)((long)x + 1);
  } while( true );
}

Assistant:

static mpc_val_t *mpcf_escape_new(mpc_val_t *x, const char *input, const char **output) {

  int i;
  int found;
  char buff[2];
  char *s = x;
  char *y = calloc(1, 1);

  while (*s) {

    i = 0;
    found = 0;

    while (output[i]) {
      if (*s == input[i]) {
        y = realloc(y, strlen(y) + strlen(output[i]) + 1);
        strcat(y, output[i]);
        found = 1;
        break;
      }
      i++;
    }

    if (!found) {
      y = realloc(y, strlen(y) + 2);
      buff[0] = *s; buff[1] = '\0';
      strcat(y, buff);
    }

    s++;
  }


  return y;
}